

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pb.cpp
# Opt level: O2

void poisbinom(double *p_value_poisbinom,int *I1_l,int *I2_l,int n,int m,uint g)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  int k;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  long *plVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int k_3;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  
  uVar7 = (ulong)(n + 1) << 3;
  if (n < -1) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar7);
  uVar7 = (ulong)(m + 1) << 3;
  if (m < -1) {
    uVar7 = 0xffffffffffffffff;
  }
  lVar16 = 0;
  while( true ) {
    pvVar8 = operator_new__(uVar7);
    if (n < lVar16) break;
    *(void **)((long)pvVar6 + lVar16 * 8) = pvVar8;
    lVar16 = lVar16 + 1;
  }
  uVar4 = n;
  if (n < 1) {
    uVar4 = 0;
  }
  iVar5 = 0;
  if (0 < m) {
    iVar5 = m;
  }
  for (uVar11 = 1; uVar11 != iVar5 + 1; uVar11 = uVar11 + 1) {
    dVar18 = 1.0;
    for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
      iVar1 = I2_l[uVar11];
      iVar2 = I1_l[uVar12 + 1];
      iVar15 = iVar2;
      if (iVar1 < iVar2) {
        iVar15 = iVar1;
      }
      if (iVar15 < 1) {
        dVar19 = 0.0;
      }
      else {
        dVar19 = (double)(iVar1 + iVar2 + -1);
      }
      *(double *)(*(long *)((long)pvVar6 + uVar12 * 8 + 8) + uVar11 * 8) = dVar19 / (double)g;
      dVar18 = dVar18 * (1.0 - dVar19 / (double)g);
    }
    *(double *)((long)pvVar8 + uVar11 * 8) = 1.0 - dVar18;
  }
  plVar9 = (long *)operator_new__(uVar7);
  lVar16 = (long)m;
  for (lVar17 = 0; lVar17 <= lVar16; lVar17 = lVar17 + 1) {
    pvVar10 = operator_new__(uVar7);
    plVar9[lVar17] = (long)pvVar10;
  }
  for (lVar17 = 0; lVar17 <= lVar16; lVar17 = lVar17 + 1) {
    lVar13 = 0;
    for (lVar14 = lVar17; lVar14 <= lVar16; lVar14 = lVar14 + 1) {
      if ((int)lVar14 == 0 && (int)lVar17 == 0) {
        *(undefined8 *)*plVar9 = 0x3ff0000000000000;
      }
      else if (lVar17 == 0) {
        *(double *)(*plVar9 + lVar14 * 8) =
             (1.0 - *(double *)((long)pvVar8 + lVar14 * 8)) * *(double *)(*plVar9 + -8 + lVar14 * 8)
        ;
      }
      else if (lVar13 == 0) {
        *(double *)(plVar9[lVar17] + lVar17 * 8) =
             *(double *)(plVar9[lVar17 + -1] + -8 + lVar17 * 8) *
             *(double *)((long)pvVar8 + lVar17 * 8);
      }
      else {
        dVar18 = *(double *)((long)pvVar8 + lVar14 * 8);
        *(double *)(plVar9[lVar17] + lVar14 * 8) =
             (1.0 - dVar18) * *(double *)(plVar9[lVar17] + -8 + lVar14 * 8) +
             dVar18 * *(double *)(plVar9[lVar17 + -1] + -8 + lVar14 * 8);
      }
      lVar13 = lVar13 + -1;
    }
  }
  pvVar10 = operator_new__(uVar7);
  lVar17 = lVar16;
  for (lVar14 = 0; lVar14 <= lVar16; lVar14 = lVar14 + 1) {
    if (lVar14 == 0) {
      *(undefined8 *)((long)pvVar10 + lVar16 * 8) = *(undefined8 *)(plVar9[lVar16] + lVar16 * 8);
    }
    else {
      *(double *)((long)pvVar10 + lVar17 * 8) =
           *(double *)((long)pvVar10 + lVar17 * 8 + 8) + *(double *)(plVar9[lVar17] + lVar16 * 8);
    }
    lVar17 = lVar17 + -1;
  }
  for (lVar17 = 0; lVar17 <= lVar16; lVar17 = lVar17 + 1) {
    p_value_poisbinom[lVar17] = *(double *)((long)pvVar10 + lVar17 * 8);
  }
  for (lVar17 = 0; lVar17 <= lVar16; lVar17 = lVar17 + 1) {
    if ((void *)plVar9[lVar17] != (void *)0x0) {
      operator_delete__((void *)plVar9[lVar17]);
    }
  }
  for (lVar16 = 0; lVar16 <= n; lVar16 = lVar16 + 1) {
    pvVar3 = *(void **)((long)pvVar6 + lVar16 * 8);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  operator_delete__(pvVar6);
  operator_delete__(pvVar8);
  operator_delete__(plVar9);
  operator_delete__(pvVar10);
  return;
}

Assistant:

void poisbinom(double* p_value_poisbinom, int* I1_l, int* I2_l, int n, int m, unsigned int g)
{
    double** q = new double* [n+1];
    for(int i=0; i<n+1; i++)
        q[i] = new double [m+1];
    double prod;
    double* p = new double [m+1];
    for(int j=1; j<=m; j++){
        int z = ceil(double(I2_l[j])/2);
        z = 1;
        prod = 1;
        for(int i=1; i<=n; i++){
            q[i][j] = 0;
            if (z<=min(I1_l[i], I2_l[j]))
                q[i][j] = I1_l[i] + I2_l[j] - 2*z + 1;
            q[i][j] = q[i][j]/g;
            prod *= (1-q[i][j]);
        }
        p[j] = 1-prod;
    }

    double** x = new double* [m+1];
    for(int k=0; k<=m; k++)
       x[k] = new double [m+1];
    for(int k=0; k<=m; k++)
    {
       for(int j=k; j<=m; j++)
       {
            if(k==0 && j==0)
                x[k][j] = 1;
            else if(k==0)
                x[k][j] = x[k][j-1] * (1-p[j]);
            else if(k==j)
                x[k][j] = x[k-1][j-1] * (p[j]);
            else
            {
                x[k][j] = x[k][j-1] * (1-p[j]) + x[k-1][j-1] * (p[j]);
            }

       }
    }
    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++)
    {
        if (k==0)
        {
            CumSum[m] = x[m][m];
        }
        else CumSum[m-k] = CumSum[m-k+1] + x[m-k][m];
    }
    for(int k=0; k<=m; k++)
    {
        p_value_poisbinom[k] = CumSum[k];
    }

    for(int k=0; k<=m; k++)
    {
        delete [] x[k];
    }
    for(int i=0; i<n+1; i++)
        delete [] q[i];
    delete [] q;
    delete [] p;
    delete [] x;
    delete [] CumSum;
}